

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlock.cpp
# Opt level: O3

uint __thiscall
Memory::SmallHeapBlockT<MediumAllocationBlockAttributes>::GetMarkCountForSweep
          (SmallHeapBlockT<MediumAllocationBlockAttributes> *this)

{
  Type *pTVar1;
  ulong *puVar2;
  code *pcVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  Type TVar8;
  Type TVar9;
  bool bVar10;
  BVIndex BVar11;
  undefined4 *puVar12;
  SmallHeapBlockBitVector *pSVar13;
  long lVar14;
  undefined1 local_120 [8];
  SmallHeapBlockBitVector temp;
  
  if (this->freeObjectList != this->lastFreeObjectHead) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar12 = 1;
    bVar10 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                        ,0x4c5,"(IsFreeBitsValid())","IsFreeBitsValid()");
    if (!bVar10) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar12 = 0;
  }
  lVar14 = 0;
  memset(local_120,0,0x100);
  js_memcpy_s(local_120,0x100,this->markBits,0x100);
  pSVar13 = GetInvalidBitVector(this);
  do {
    puVar2 = (ulong *)((long)(temp.data + -1) + lVar14);
    *puVar2 = *puVar2 & ~*(ulong *)((long)&pSVar13->data[0].word + lVar14);
    lVar14 = lVar14 + 8;
  } while (lVar14 != 0x100);
  if (this->freeCount != 0) {
    lVar14 = 0;
    do {
      pTVar1 = (this->freeBits).data + lVar14;
      uVar4 = *(uint *)((long)&pTVar1->word + 4);
      TVar8 = pTVar1[1].word;
      uVar5 = *(uint *)((long)&pTVar1[1].word + 4);
      uVar6 = *(uint *)((long)&temp.data[lVar14 + -1].word + 4);
      TVar9 = temp.data[lVar14].word;
      uVar7 = *(uint *)((long)&temp.data[lVar14].word + 4);
      *(uint *)&temp.data[lVar14 + -1].word =
           ~(uint)pTVar1->word & (uint)temp.data[lVar14 + -1].word;
      *(uint *)((long)&temp.data[lVar14 + -1].word + 4) = ~uVar4 & uVar6;
      *(uint *)&temp.data[lVar14].word = ~(uint)TVar8 & (uint)TVar9;
      *(uint *)((long)&temp.data[lVar14].word + 4) = ~uVar5 & uVar7;
      lVar14 = lVar14 + 2;
    } while (lVar14 != 0x20);
  }
  BVar11 = BVStatic<2048UL>::Count((BVStatic<2048UL> *)local_120);
  return BVar11;
}

Assistant:

uint
SmallHeapBlockT<TBlockAttributes>::GetMarkCountForSweep()
{
    Assert(IsFreeBitsValid());

    // Make a local copy of mark bits, so we don't modify the actual mark bits.
    SmallHeapBlockBitVector temp;
    temp.Copy(this->GetMarkedBitVector());

    // Remove any invalid bits that may have been set
    temp.Minus(this->GetInvalidBitVector());

    // Remove the mark bit for things that are still free
    if (this->freeCount != 0)
    {
        temp.Minus(this->GetFreeBitVector());
    }

    return temp.Count();
}